

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
DumpStats(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this)

{
  code *pcVar1;
  char cVar2;
  Page *this_00;
  bool bVar3;
  uint uVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  DListNodeBase<Memory::CustomHeap::Page> *node;
  BVUnitT<unsigned_long> local_48;
  BVUnit usedBitVector;
  Page *page;
  EditingIterator bucketIter;
  int i;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  Output::Print(L"Total allocation size: %d\n",this->totalAllocationSize);
  Output::Flush();
  Output::Print(L"Total free size: %d\n",this->freeObjectSize);
  Output::Flush();
  Output::Print(L"Total allocations since last compact: %d\n",this->allocationsSinceLastCompact);
  Output::Flush();
  Output::Print(L"Total frees since last compact: %d\n",this->freesSinceLastCompact);
  Output::Flush();
  uVar4 = RealCount::Count(&(this->largeObjectAllocations).super_RealCount);
  Output::Print(L"Large object count: %d\n",(ulong)uVar4);
  Output::Flush();
  Output::Print(L"Buckets: \n");
  Output::Flush();
  bucketIter.super_Iterator.current._4_4_ = 0;
  do {
    if (6 < bucketIter.super_Iterator.current._4_4_) {
      return;
    }
    cVar2 = (char)bucketIter.super_Iterator.current._4_4_;
    uVar4 = RealCount::Count(&this->buckets[bucketIter.super_Iterator.current._4_4_].super_RealCount
                            );
    Output::Print(L"\t%d => %u [",(ulong)(uint)(1 << (cVar2 + 7U & 0x1f)),(ulong)uVar4);
    DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::EditingIterator
              ((EditingIterator *)&page,this->buckets + bucketIter.super_Iterator.current._4_4_);
    while( true ) {
      if (bucketIter.super_Iterator.list == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = page;
      node = DListNodeBase<Memory::CustomHeap::Page>::Next
                       (&(bucketIter.super_Iterator.list)->
                         super_DListNodeBase<Memory::CustomHeap::Page>);
      bVar3 = DListBase<Memory::CustomHeap::Page,_RealCount>::IsHead
                        ((DListBase<Memory::CustomHeap::Page,_RealCount> *)this_00,node);
      if (bVar3) break;
      bucketIter.super_Iterator.list =
           (DListBase<Memory::CustomHeap::Page,_RealCount> *)
           DListNodeBase<Memory::CustomHeap::Page>::Next
                     (&(bucketIter.super_Iterator.list)->
                       super_DListNodeBase<Memory::CustomHeap::Page>);
      usedBitVector.word =
           (Type)DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data((Iterator *)&page);
      local_48.word = (((Page *)usedBitVector.word)->freeBitVector).word;
      BVUnitT<unsigned_long>::ComplimentAll(&local_48);
      BVar5 = BVUnitT<unsigned_long>::Count(&local_48);
      Output::Print(L" %u ",(ulong)(BVar5 << 7));
    }
    bucketIter.super_Iterator.list = (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0;
    uVar4 = RealCount::Count(&this->fullPages[bucketIter.super_Iterator.current._4_4_].
                              super_RealCount);
    Output::Print(L"] {{%u}}\n",(ulong)uVar4);
    bucketIter.super_Iterator.current._4_4_ = bucketIter.super_Iterator.current._4_4_ + 1;
  } while( true );
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::DumpStats()
{
    HeapTrace(_u("Total allocation size: %d\n"), totalAllocationSize);
    HeapTrace(_u("Total free size: %d\n"), freeObjectSize);
    HeapTrace(_u("Total allocations since last compact: %d\n"), allocationsSinceLastCompact);
    HeapTrace(_u("Total frees since last compact: %d\n"), freesSinceLastCompact);
    HeapTrace(_u("Large object count: %d\n"), this->largeObjectAllocations.Count());

    HeapTrace(_u("Buckets: \n"));
    for (int i = 0; i < BucketId::NumBuckets; i++)
    {
        Output::Print(_u("\t%d => %u ["), (1 << (i + 7)), buckets[i].Count());

        FOREACH_DLISTBASE_ENTRY_EDITING(Page, page, &this->buckets[i], bucketIter)
        {
            BVUnit usedBitVector = page.freeBitVector;
            usedBitVector.ComplimentAll(); // Get the actual used bit vector
            Output::Print(_u(" %u "), usedBitVector.Count() * Page::Alignment); // Print out the space used in this page
        }

        NEXT_DLISTBASE_ENTRY_EDITING
            Output::Print(_u("] {{%u}}\n"), this->fullPages[i].Count());
    }
}